

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.h
# Opt level: O0

void __thiscall
kiste::line_data_t::line_data_t
          (line_data_t *this,line_type type,
          vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *segments)

{
  vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *segments_local;
  line_type type_local;
  line_data_t *this_local;
  
  this->_type = type;
  std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
            (&this->_segments,segments);
  class_t::class_t(&this->_class_data);
  member_t::member_t(&this->_member);
  return;
}

Assistant:

line_data_t(line_type type, const std::vector<segment_t>& segments)
        : _type(type), _segments(segments)
    {
    }